

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int TPZFMatrix<long_double>::Substitution
              (longdouble *ptr,int64_t rows,TPZFMatrix<long_double> *B,TPZVec<int> *index)

{
  longdouble lVar1;
  longdouble lVar2;
  int *piVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  longdouble *plVar8;
  longdouble *plVar9;
  ulong uVar10;
  long lVar11;
  int64_t iVar12;
  longdouble *plVar13;
  bool bVar14;
  longdouble lVar15;
  TPZVec<long_double> v;
  
  if (B == (TPZFMatrix<long_double> *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "static int TPZFMatrix<long double>::Substitution(const TVar *, int64_t, TPZFMatrix<TVar> *, const TPZVec<int> &) [TVar = long double]"
                            );
    poVar4 = std::operator<<(poVar4,"TPZFMatrix<>*B eh nulo");
  }
  else {
    if ((index->fNElements == rows) &&
       ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow == rows)) {
      TPZVec<long_double>::TPZVec(&v,rows);
      piVar3 = index->fStore;
      lVar7 = 0;
      lVar5 = 0;
      plVar8 = v.fStore;
      if (0 < rows) {
        lVar5 = rows;
      }
      for (; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        *plVar8 = B->fElem[piVar3[lVar7]];
        plVar8 = plVar8 + 1;
      }
      uVar6 = rows * 0x10;
      plVar8 = ptr;
      for (lVar7 = 0; plVar9 = v.fStore, plVar13 = plVar8, lVar11 = lVar7, lVar15 = (longdouble)0,
          lVar7 != lVar5; lVar7 = lVar7 + 1) {
        while (lVar11 != 0) {
          lVar1 = *plVar13;
          lVar2 = *plVar9;
          plVar9 = plVar9 + 1;
          plVar13 = plVar13 + rows;
          lVar11 = lVar11 + -1;
          lVar15 = lVar2 * lVar1 + lVar15;
        }
        v.fStore[lVar7] = v.fStore[lVar7] - lVar15;
        plVar8 = plVar8 + 1;
      }
      plVar8 = (longdouble *)((long)ptr + (uVar6 + 0x10) * rows + -0x10);
      uVar10 = uVar6 ^ 0xfffffffffffffff0;
      iVar12 = rows;
      while (0 < iVar12) {
        lVar7 = iVar12 + -1;
        plVar13 = (longdouble *)((long)v.fStore + uVar6);
        plVar9 = plVar8;
        lVar15 = (longdouble)0;
        for (; iVar12 < rows; iVar12 = iVar12 + 1) {
          lVar15 = *plVar13 * *plVar9 + lVar15;
          plVar13 = plVar13 + 1;
          plVar9 = plVar9 + rows;
        }
        v.fStore[lVar7] = (v.fStore[lVar7] - lVar15) / ptr[lVar7 * (rows + 1)];
        uVar6 = uVar6 - 0x10;
        plVar8 = (longdouble *)((long)plVar8 + uVar10);
        iVar12 = lVar7;
      }
      lVar7 = 0;
      while (bVar14 = lVar5 != 0, lVar5 = lVar5 + -1, bVar14) {
        *(unkbyte10 *)((long)B->fElem + lVar7) = *(unkbyte10 *)((long)v.fStore + lVar7);
        lVar7 = lVar7 + 0x10;
      }
      TPZVec<long_double>::~TPZVec(&v);
      return 1;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2dfd0e);
    poVar4 = std::operator<<(poVar4,"this->fIndex = ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4,"  b = ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  }
  std::endl<char,std::char_traits<char>>(poVar4);
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Substitution(const TVar *ptr, int64_t rows, TPZFMatrix<TVar> *B, const TPZVec<int> &index )
{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    
    
    if (index.NElements() != rows || b.Rows() != rows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t i,j;
    TVar sum = 0;
    
    TPZVec<TVar> v(rows);
    
    
    for (i=0;i<rows;i++)
    {
        v[i] = b(index[i]);
    }
    
    //Ly=b
    for (i=0;i<rows;i++)
    {
        sum = 0.;
        for (j=0;j<(i);j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] -= sum;
    }
    
    //Ux=y
    for (i=(rows-1);i>-1;i--)
    {
        sum = 0.;
        for (j=(i+1);j<rows;j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] = (v[i] - sum) / SELECTEL(ptr,rows,i,i);
    }
    
    for (i=0;i<rows;i++) b(i) = v[i];
    return 1;
}